

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O0

LY_ERR lyd_insert_hash_add(ly_ht *ht,lyd_node *node,ly_bool empty_ht)

{
  char *pcVar1;
  LY_ERR LVar2;
  uint32_t uVar3;
  size_t sVar4;
  ly_ctx *local_58;
  ly_ctx *local_50;
  ly_ctx *local_30;
  uint32_t hash;
  ly_bool empty_ht_local;
  lyd_node *node_local;
  ly_ht *ht_local;
  
  _hash = node;
  node_local = (lyd_node *)ht;
  if (((ht == (ly_ht *)0x0) || (node == (lyd_node *)0x0)) || (node->schema == (lysc_node *)0x0)) {
    __assert_fail("ht && node && node->schema",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
                  ,0x80,"LY_ERR lyd_insert_hash_add(struct ly_ht *, struct lyd_node *, ly_bool)");
  }
  LVar2 = lyht_insert_no_check(ht,&hash,node->hash,(void **)0x0);
  if (LVar2 != LY_SUCCESS) {
    if (_hash->schema == (lysc_node *)0x0) {
      local_30 = (ly_ctx *)_hash[2].schema;
    }
    else {
      local_30 = _hash->schema->module->ctx;
    }
    ly_log(local_30,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
           ,0x84);
    return LY_EINT;
  }
  if (((_hash->schema->nodetype & 0x18) != 0) &&
     ((_hash->prev->next == (lyd_node *)0x0 || (_hash->prev->schema != _hash->schema)))) {
    pcVar1 = _hash->schema->module->name;
    sVar4 = strlen(_hash->schema->module->name);
    uVar3 = lyht_hash_multi(0,pcVar1,sVar4);
    pcVar1 = _hash->schema->name;
    sVar4 = strlen(_hash->schema->name);
    uVar3 = lyht_hash_multi(uVar3,pcVar1,sVar4);
    uVar3 = lyht_hash_multi(uVar3,(char *)0x0,0);
    if ((empty_ht == '\0') &&
       (((_hash->next != (lyd_node *)0x0 && (_hash->next->schema == _hash->schema)) &&
        (LVar2 = lyht_remove((ly_ht *)node_local,&_hash->next,uVar3), LVar2 != LY_SUCCESS)))) {
      if (_hash->schema == (lysc_node *)0x0) {
        local_50 = (ly_ctx *)_hash[2].schema;
      }
      else {
        local_50 = _hash->schema->module->ctx;
      }
      ly_log(local_50,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
             ,0x92);
      return LY_EINT;
    }
    if (uVar3 == _hash->hash) {
      __assert_fail("hash != node->hash",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
                    ,0x97,"LY_ERR lyd_insert_hash_add(struct ly_ht *, struct lyd_node *, ly_bool)");
    }
    LVar2 = lyht_insert((ly_ht *)node_local,&hash,uVar3,(void **)0x0);
    if (LVar2 != LY_SUCCESS) {
      if (_hash->schema == (lysc_node *)0x0) {
        local_58 = (ly_ctx *)_hash[2].schema;
      }
      else {
        local_58 = _hash->schema->module->ctx;
      }
      ly_log(local_58,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
             ,0x9b);
      return LY_EINT;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_insert_hash_add(struct ly_ht *ht, struct lyd_node *node, ly_bool empty_ht)
{
    uint32_t hash;

    assert(ht && node && node->schema);

    /* add node itself */
    if (lyht_insert_no_check(ht, &node, node->hash, NULL)) {
        LOGINT_RET(LYD_CTX(node));
    }

    /* add first instance of a (leaf-)list */
    if ((node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) &&
            (!node->prev->next || (node->prev->schema != node->schema))) {
        /* get the simple hash */
        hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
        hash = lyht_hash_multi(hash, node->schema->name, strlen(node->schema->name));
        hash = lyht_hash_multi(hash, NULL, 0);

        /* remove any previous stored instance, only if we did not start with an empty HT */
        if (!empty_ht && node->next && (node->next->schema == node->schema)) {
            if (lyht_remove(ht, &node->next, hash)) {
                LOGINT_RET(LYD_CTX(node));
            }
        }

        /* in this case there would be the exact same value twice in the hash table, not supported (by the HT) */
        assert(hash != node->hash);

        /* insert this instance as the first (leaf-)list instance */
        if (lyht_insert(ht, &node, hash, NULL)) {
            LOGINT_RET(LYD_CTX(node));
        }
    }

    return LY_SUCCESS;
}